

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O3

void sha512_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  int iVar1;
  BinarySink *val;
  ssh_hashalg *psVar2;
  ulong uVar3;
  
  val = hash[-3].binarysink_;
  psVar2 = hash[-2].vt;
  iVar1 = *(int *)&hash[-3].vt;
  BinarySink_put_byte(hash[-1].binarysink_,0x80);
  BinarySink_put_padding(hash[-1].binarysink_,(ulong)(0x6fU - iVar1 & 0x7f),'\0');
  BinarySink_put_uint64(hash[-1].binarysink_,(uint64_t)val);
  BinarySink_put_uint64(hash[-1].binarysink_,(uint64_t)psVar2);
  if (hash[-3].vt == (ssh_hashalg *)0x0) {
    if (7 < hash->vt->hlen) {
      uVar3 = 0;
      do {
        psVar2 = (&hash[-0xf].vt)[uVar3];
        *(ulong *)(digest + uVar3 * 8) =
             (ulong)psVar2 >> 0x38 | ((ulong)psVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)psVar2 & 0xff0000000000) >> 0x18 | ((ulong)psVar2 & 0xff00000000) >> 8 |
             ((ulong)psVar2 & 0xff000000) << 8 | ((ulong)psVar2 & 0xff0000) << 0x18 |
             ((ulong)psVar2 & 0xff00) << 0x28 | (long)psVar2 << 0x38;
        uVar3 = uVar3 + 1;
      } while (uVar3 < hash->vt->hlen >> 3);
    }
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha512.h",
                0x82,"void sha512_block_pad(sha512_block *, BinarySink *)");
}

Assistant:

static void sha512_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha512_sw *s = container_of(hash, sha512_sw, hash);

    sha512_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < hash->vt->hlen / 8; i++)
        PUT_64BIT_MSB_FIRST(digest + 8*i, s->core[i]);
}